

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  uint64_t uVar2;
  uint local_3c;
  undefined1 local_38 [4];
  uint32_t i;
  Roaring r1;
  
  r1.roaring.high_low_container._36_4_ = 0;
  roaring::Roaring::Roaring((Roaring *)local_38);
  for (local_3c = 100; local_3c < 1000; local_3c = local_3c + 1) {
    roaring::Roaring::add((Roaring *)local_38,local_3c);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"cardinality = ");
  uVar2 = roaring::Roaring::cardinality((Roaring *)local_38);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  r1.roaring.high_low_container._36_4_ = 0;
  roaring::Roaring::~Roaring((Roaring *)local_38);
  return r1.roaring.high_low_container._36_4_;
}

Assistant:

int main() {
  Roaring r1;
  for (uint32_t i = 100; i < 1000; i++) {
    r1.add(i);
  }
  std::cout << "cardinality = " << r1.cardinality() << std::endl;

  return 0;
}